

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O1

void __thiscall
cbtQuantizedBvh::walkStacklessTreeAgainstRay
          (cbtQuantizedBvh *this,cbtNodeOverlapCallback *nodeCallback,cbtVector3 *raySource,
          cbtVector3 *rayTarget,cbtVector3 *aabbMin,cbtVector3 *aabbMax,int startNodeIndex,
          int endNodeIndex)

{
  cbtScalar cVar1;
  cbtScalar cVar2;
  float fVar3;
  cbtScalar cVar4;
  cbtScalar cVar5;
  float fVar6;
  cbtScalar cVar7;
  cbtScalar cVar8;
  float fVar9;
  int iVar10;
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  ulong uVar14;
  undefined8 uVar15;
  bool bVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  bool bVar20;
  int iVar21;
  int iVar22;
  cbtQuantizedBvh *pcVar23;
  cbtVector3 *pcVar24;
  cbtOptimizedBvhNode *pcVar25;
  ulong uVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 in_ZMM20 [64];
  cbtVector3 bounds [2];
  float local_e8 [4];
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  undefined4 uStack_cc;
  float *local_c8;
  float *local_c0;
  float *local_b8;
  float *local_b0;
  float *local_a8;
  cbtVector3 *local_a0;
  cbtQuantizedBvh *local_98;
  cbtVector3 *local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  float *local_58;
  cbtNodeOverlapCallback *local_50;
  undefined1 local_48 [16];
  
  pcVar25 = (this->m_contiguousNodes).m_data;
  cVar1 = raySource->m_floats[0];
  cVar2 = raySource->m_floats[1];
  fVar3 = raySource->m_floats[2];
  cVar4 = rayTarget->m_floats[0];
  cVar5 = rayTarget->m_floats[1];
  fVar28 = rayTarget->m_floats[2];
  fVar6 = aabbMin->m_floats[2];
  cVar7 = aabbMax->m_floats[0];
  cVar8 = aabbMax->m_floats[1];
  fVar9 = aabbMax->m_floats[2];
  auVar29 = vsubss_avx512f(ZEXT416((uint)cVar4),ZEXT416((uint)cVar1));
  auVar30 = vsubss_avx512f(ZEXT416((uint)cVar5),ZEXT416((uint)cVar2));
  fVar27 = auVar30._0_4_;
  fVar13 = fVar28 - fVar3;
  auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar27 * fVar27)),auVar29,auVar29);
  vfmadd231ss_fma(auVar30,ZEXT416((uint)fVar13),ZEXT416((uint)fVar13));
  auVar31 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
  auVar30 = vucomiss_avx512f(auVar31);
  local_a0 = raySource;
  local_98 = this;
  local_90 = aabbMax;
  local_50 = nodeCallback;
  if (&stack0xffffffffffffffd0 < (undefined1 *)0xd8) {
    local_68._0_4_ = fVar3;
    local_78._0_4_ = cVar2;
    local_88._0_4_ = cVar1;
    local_a8 = (float *)CONCAT44(local_a8._4_4_,aabbMin->m_floats[1]);
    local_b0 = (float *)CONCAT44(local_b0._4_4_,aabbMin->m_floats[0]);
    local_b8 = (float *)CONCAT44(local_b8._4_4_,auVar29._0_4_);
    local_c0 = (float *)CONCAT44(local_c0._4_4_,fVar27);
    local_c8 = (float *)CONCAT44(local_c8._4_4_,fVar13);
    fVar34 = sqrtf(auVar30._0_4_);
    auVar31 = vxorps_avx512vl(auVar31,auVar31);
  }
  else {
    auVar30 = vsqrtss_avx(auVar30,auVar30);
    fVar34 = auVar30._0_4_;
    local_b0._0_4_ = aabbMin->m_floats[0];
    local_a8._0_4_ = aabbMin->m_floats[1];
    local_c8._0_4_ = fVar13;
    local_68._0_4_ = fVar3;
    local_78._0_4_ = cVar2;
    local_88._0_4_ = cVar1;
    local_c0._0_4_ = fVar27;
    local_b8._0_4_ = auVar29._0_4_;
  }
  if (local_98->m_curNodeIndex < 1) {
    iVar22 = 0;
  }
  else {
    fVar34 = 1.0 / fVar34;
    local_b8._0_4_ = local_b8._0_4_ * fVar34;
    local_c0._0_4_ = local_c0._0_4_ * fVar34;
    local_c8._0_4_ = local_c8._0_4_ * fVar34;
    auVar30 = vfmadd231ss_fma(ZEXT416((uint)(local_c0._0_4_ *
                                            (rayTarget->m_floats[1] - local_a0->m_floats[1]))),
                              ZEXT416((uint)local_b8._0_4_),
                              ZEXT416((uint)(rayTarget->m_floats[0] - local_a0->m_floats[0])));
    local_48 = vfmadd231ss_fma(auVar30,ZEXT416((uint)local_c8._0_4_),
                               ZEXT416((uint)(rayTarget->m_floats[2] - local_a0->m_floats[2])));
    uVar15 = vcmpss_avx512f(ZEXT416((uint)local_c0._0_4_),auVar31,0);
    bVar16 = (bool)((byte)uVar15 & 1);
    fVar27 = (float)((uint)bVar16 * 0x5d5e0b6b + (uint)!bVar16 * (int)(1.0 / local_c0._0_4_));
    auVar35 = ZEXT1664(ZEXT416((uint)fVar27));
    uVar15 = vcmpss_avx512f(ZEXT416((uint)local_c8._0_4_),auVar31,0);
    bVar16 = (bool)((byte)uVar15 & 1);
    fVar34 = (float)((uint)bVar16 * 0x5d5e0b6b + (uint)!bVar16 * (int)(1.0 / local_c8._0_4_));
    auVar36 = ZEXT1664(ZEXT416((uint)fVar34));
    auVar30 = vminss_avx512f(ZEXT416((uint)cVar4),ZEXT416((uint)local_88._0_4_));
    fVar3 = local_b0._0_4_ + auVar30._0_4_;
    auVar30 = vminss_avx512f(ZEXT416((uint)cVar5),ZEXT416((uint)local_78._0_4_));
    fVar13 = local_a8._0_4_ + auVar30._0_4_;
    auVar29 = vminss_avx(ZEXT416((uint)fVar28),ZEXT416((uint)local_68._0_4_));
    auVar30 = vmaxss_avx512f(ZEXT416((uint)cVar4),ZEXT416((uint)local_88._0_4_));
    auVar32 = vaddss_avx512f(auVar30,ZEXT416((uint)cVar7));
    auVar30 = vmaxss_avx512f(ZEXT416((uint)cVar5),ZEXT416((uint)local_78._0_4_));
    auVar33 = vaddss_avx512f(auVar30,ZEXT416((uint)cVar8));
    auVar30 = vmaxss_avx(ZEXT416((uint)fVar28),ZEXT416((uint)local_68._0_4_));
    uVar15 = vcmpss_avx512f(ZEXT416((uint)local_b8._0_4_),auVar31,0);
    bVar16 = (bool)((byte)uVar15 & 1);
    fVar28 = (float)((uint)bVar16 * 0x5d5e0b6b + (uint)!bVar16 * (int)(1.0 / local_b8._0_4_));
    local_88 = ZEXT416((uint)fVar28);
    auVar37 = ZEXT1664(local_88);
    local_a8 = local_e8 + (ulong)(fVar28 < 0.0) * 4;
    local_b8 = local_e8 + (ulong)(0.0 <= fVar28) * 4;
    local_c0 = local_e8 + (ulong)(fVar27 < 0.0) * 4 + 1;
    local_b0 = local_e8 + (ulong)(0.0 <= fVar27) * 4 + 1;
    local_58 = local_e8 + (ulong)(fVar34 < 0.0) * 4 + 2;
    local_c8 = local_e8 + (ulong)(0.0 <= fVar34) * 4 + 2;
    iVar22 = 0;
    iVar21 = 0;
    pcVar23 = local_98;
    pcVar24 = local_90;
    local_78 = ZEXT416((uint)fVar34);
    local_68 = ZEXT416((uint)fVar27);
    do {
      uVar15 = *(undefined8 *)(pcVar25->m_aabbMinOrg).m_floats;
      uVar17 = *(undefined8 *)((pcVar25->m_aabbMinOrg).m_floats + 2);
      uVar18 = *(undefined8 *)(pcVar25->m_aabbMaxOrg).m_floats;
      uVar19 = *(undefined8 *)((pcVar25->m_aabbMaxOrg).m_floats + 2);
      local_e8[0] = (float)uVar15;
      local_e8[1] = (float)((ulong)uVar15 >> 0x20);
      local_e8[1] = local_e8[1] - pcVar24->m_floats[1];
      local_e8[0] = local_e8[0] - pcVar24->m_floats[0];
      local_e8[2] = (float)uVar17;
      local_e8[3] = (float)((ulong)uVar17 >> 0x20);
      local_e8[2] = local_e8[2] - pcVar24->m_floats[2];
      local_d8 = (float)uVar18;
      fStack_d4 = (float)((ulong)uVar18 >> 0x20);
      _local_d8 = CONCAT44(fStack_d4 - aabbMin->m_floats[1],local_d8 - aabbMin->m_floats[0]);
      fStack_d0 = (float)uVar19;
      _fStack_d0 = CONCAT44((int)((ulong)uVar19 >> 0x20),fStack_d0 - aabbMin->m_floats[2]);
      bVar16 = true;
      if ((fVar3 <= (pcVar25->m_aabbMaxOrg).m_floats[0]) &&
         (bVar16 = true, (pcVar25->m_aabbMinOrg).m_floats[0] <= auVar32._0_4_)) {
        bVar16 = false;
      }
      bVar20 = true;
      if ((fVar6 + auVar29._0_4_ <= (pcVar25->m_aabbMaxOrg).m_floats[2]) &&
         ((pcVar25->m_aabbMinOrg).m_floats[2] <= fVar9 + auVar30._0_4_)) {
        bVar20 = bVar16;
      }
      if (((pcVar25->m_aabbMaxOrg).m_floats[1] < fVar13) ||
         (bVar20 || auVar33._0_4_ < (pcVar25->m_aabbMinOrg).m_floats[1])) {
        uVar26 = 0;
      }
      else {
        fVar28 = auVar37._0_4_ * (*local_a8 - local_a0->m_floats[0]);
        fVar27 = auVar35._0_4_ * (*local_b0 - local_a0->m_floats[1]);
        uVar26 = 0;
        if (fVar28 <= fVar27) {
          fVar34 = auVar37._0_4_ * (*local_b8 - local_a0->m_floats[0]);
          fVar12 = auVar35._0_4_ * (*local_c0 - local_a0->m_floats[1]);
          if (fVar12 <= fVar34) {
            auVar31 = vmaxss_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar28));
            fVar28 = auVar36._0_4_ * (*local_c8 - local_a0->m_floats[2]);
            uVar26 = 0;
            if (auVar31._0_4_ <= fVar28) {
              auVar11 = vminss_avx(ZEXT416((uint)fVar27),ZEXT416((uint)fVar34));
              fVar27 = auVar36._0_4_ * (*local_58 - local_a0->m_floats[2]);
              uVar26 = 0;
              if (fVar27 <= auVar11._0_4_) {
                auVar31 = vmaxss_avx(ZEXT416((uint)fVar27),auVar31);
                auVar11 = vminss_avx(ZEXT416((uint)fVar28),auVar11);
                uVar26 = vcmpps_avx512vl(auVar31,local_48,1);
                uVar14 = vcmpps_avx512vl(auVar11,ZEXT816(0),0xe);
                uVar26 = uVar26 & uVar14;
              }
            }
          }
        }
      }
      iVar10 = pcVar25->m_escapeIndex;
      if (((uVar26 & 1) != 0) && (iVar10 == -1)) {
        (*local_50->_vptr_cbtNodeOverlapCallback[2])
                  (local_50,(ulong)(uint)pcVar25->m_subPart,(ulong)(uint)pcVar25->m_triangleIndex);
        auVar37 = ZEXT1664(local_88);
        auVar36 = ZEXT1664(local_78);
        auVar35 = ZEXT1664(local_68);
        pcVar23 = local_98;
        pcVar24 = local_90;
      }
      if ((~(byte)uVar26 & iVar10 != -1) == 0) {
        pcVar25 = pcVar25 + 1;
        iVar21 = iVar21 + 1;
      }
      else {
        iVar21 = iVar21 + pcVar25->m_escapeIndex;
        pcVar25 = pcVar25 + pcVar25->m_escapeIndex;
      }
      iVar22 = iVar22 + 1;
    } while (iVar21 < pcVar23->m_curNodeIndex);
  }
  if (maxIterations < iVar22) {
    maxIterations = iVar22;
  }
  return;
}

Assistant:

void cbtQuantizedBvh::walkStacklessTreeAgainstRay(cbtNodeOverlapCallback* nodeCallback, const cbtVector3& raySource, const cbtVector3& rayTarget, const cbtVector3& aabbMin, const cbtVector3& aabbMax, int startNodeIndex, int endNodeIndex) const
{
	cbtAssert(!m_useQuantization);

	const cbtOptimizedBvhNode* rootNode = &m_contiguousNodes[0];
	int escapeIndex, curIndex = 0;
	int walkIterations = 0;
	bool isLeafNode;
	//PCK: unsigned instead of bool
	unsigned aabbOverlap = 0;
	unsigned rayBoxOverlap = 0;
	cbtScalar lambda_max = 1.0;

	/* Quick pruning by quantized box */
	cbtVector3 rayAabbMin = raySource;
	cbtVector3 rayAabbMax = raySource;
	rayAabbMin.setMin(rayTarget);
	rayAabbMax.setMax(rayTarget);

	/* Add box cast extents to bounding box */
	rayAabbMin += aabbMin;
	rayAabbMax += aabbMax;

#ifdef RAYAABB2
	cbtVector3 rayDir = (rayTarget - raySource);
	rayDir.normalize();
	lambda_max = rayDir.dot(rayTarget - raySource);
	///what about division by zero? --> just set rayDirection[i] to 1.0
	cbtVector3 rayDirectionInverse;
	rayDirectionInverse[0] = rayDir[0] == cbtScalar(0.0) ? cbtScalar(BT_LARGE_FLOAT) : cbtScalar(1.0) / rayDir[0];
	rayDirectionInverse[1] = rayDir[1] == cbtScalar(0.0) ? cbtScalar(BT_LARGE_FLOAT) : cbtScalar(1.0) / rayDir[1];
	rayDirectionInverse[2] = rayDir[2] == cbtScalar(0.0) ? cbtScalar(BT_LARGE_FLOAT) : cbtScalar(1.0) / rayDir[2];
	unsigned int sign[3] = {rayDirectionInverse[0] < 0.0, rayDirectionInverse[1] < 0.0, rayDirectionInverse[2] < 0.0};
#endif

	cbtVector3 bounds[2];

	while (curIndex < m_curNodeIndex)
	{
		cbtScalar param = 1.0;
		//catch bugs in tree data
		cbtAssert(walkIterations < m_curNodeIndex);

		walkIterations++;

		bounds[0] = rootNode->m_aabbMinOrg;
		bounds[1] = rootNode->m_aabbMaxOrg;
		/* Add box cast extents */
		bounds[0] -= aabbMax;
		bounds[1] -= aabbMin;

		aabbOverlap = TestAabbAgainstAabb2(rayAabbMin, rayAabbMax, rootNode->m_aabbMinOrg, rootNode->m_aabbMaxOrg);
		//perhaps profile if it is worth doing the aabbOverlap test first

#ifdef RAYAABB2
		///careful with this check: need to check division by zero (above) and fix the unQuantize method
		///thanks Joerg/hiker for the reproduction case!
		///http://www.bulletphysics.com/Bullet/phpBB3/viewtopic.php?f=9&t=1858
		rayBoxOverlap = aabbOverlap ? cbtRayAabb2(raySource, rayDirectionInverse, sign, bounds, param, 0.0f, lambda_max) : false;

#else
		cbtVector3 normal;
		rayBoxOverlap = cbtRayAabb(raySource, rayTarget, bounds[0], bounds[1], param, normal);
#endif

		isLeafNode = rootNode->m_escapeIndex == -1;

		//PCK: unsigned instead of bool
		if (isLeafNode && (rayBoxOverlap != 0))
		{
			nodeCallback->processNode(rootNode->m_subPart, rootNode->m_triangleIndex);
		}

		//PCK: unsigned instead of bool
		if ((rayBoxOverlap != 0) || isLeafNode)
		{
			rootNode++;
			curIndex++;
		}
		else
		{
			escapeIndex = rootNode->m_escapeIndex;
			rootNode += escapeIndex;
			curIndex += escapeIndex;
		}
	}
	if (maxIterations < walkIterations)
		maxIterations = walkIterations;
}